

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

int set_dict(PyObject *op,PyObject *new_dict,void *param_3)

{
  long *plVar1;
  int iVar2;
  undefined8 *puVar3;
  
  if ((new_dict->ob_type->tp_flags & 0x20000000) == 0) {
    PyErr_Format(_PyExc_TypeError,"__dict__ must be set to a dictionary, not a \'%.200s\'",
                 new_dict->ob_type->tp_name);
    iVar2 = -1;
  }
  else {
    puVar3 = (undefined8 *)_PyObject_GetDictPtr();
    new_dict->ob_refcnt = new_dict->ob_refcnt + 1;
    plVar1 = (long *)*puVar3;
    if (plVar1 != (long *)0x0) {
      *puVar3 = 0;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        _Py_Dealloc();
      }
    }
    *puVar3 = new_dict;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

inline int set_dict(PyObject *op, PyObject *new_dict, void *) {
    if (!PyDict_Check(new_dict)) {
        PyErr_Format(PyExc_TypeError, "__dict__ must be set to a dictionary, not a '%.200s'",
                     Py_TYPE(new_dict)->tp_name);
        return -1;
    }
    PyObject *&dict = *_PyObject_GetDictPtr(op);
    Py_INCREF(new_dict);
    Py_CLEAR(dict);
    dict = new_dict;
    return 0;
}